

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# option-parser.cc
# Opt level: O0

void __thiscall
wabt::OptionParser::Argument::Argument
          (Argument *this,string *name,ArgumentCount count,Callback *callback)

{
  Callback *callback_local;
  ArgumentCount count_local;
  string *name_local;
  Argument *this_local;
  
  std::__cxx11::string::string((string *)this,(string *)name);
  this->count = count;
  std::function<void_(const_char_*)>::function(&this->callback,callback);
  this->handled_count = 0;
  return;
}

Assistant:

OptionParser::Argument::Argument(const std::string& name,
                                 ArgumentCount count,
                                 const Callback& callback)
    : name(name), count(count), callback(callback) {}